

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::updateLastInputTime(WindowImplX11 *this,Time time)

{
  Atom AVar1;
  Time time_local;
  string local_40;
  
  if ((time != 0) && (this->m_lastInputTime != time)) {
    time_local = time;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"_NET_WM_USER_TIME","");
    AVar1 = getAtom(&local_40,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (AVar1 != 0) {
      XChangeProperty(this->m_display,this->m_window,AVar1,6,0x20,0,&time_local,1);
      time = time_local;
    }
    this->m_lastInputTime = time;
  }
  return;
}

Assistant:

void WindowImplX11::updateLastInputTime(::Time time)
{
    if (time && (time != m_lastInputTime))
    {
        Atom netWmUserTime = getAtom("_NET_WM_USER_TIME", true);

        if (netWmUserTime)
        {
            XChangeProperty(m_display,
                            m_window,
                            netWmUserTime,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&time),
                            1);
        }

        m_lastInputTime = time;
    }
}